

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextBuffer::appendv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__dest;
  ImGuiContext *pIVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  va_list args_copy;
  __va_list_tag local_48;
  
  local_48.reg_save_area = args->reg_save_area;
  local_48.gp_offset = args->gp_offset;
  local_48.fp_offset = args->fp_offset;
  local_48.overflow_arg_area = args->overflow_arg_area;
  iVar4 = vsnprintf((char *)0x0,0,fmt,args);
  pIVar5 = GImGui;
  if (iVar4 < 1) {
    return;
  }
  iVar2 = (this->Buf).Size;
  iVar6 = iVar2 + iVar4;
  iVar3 = (this->Buf).Capacity;
  if (iVar6 < iVar3) {
LAB_00158f6d:
    if (iVar6 <= iVar3) {
      __dest = (this->Buf).Data;
      goto LAB_00159000;
    }
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar8 <= iVar6) {
      iVar8 = iVar6;
    }
  }
  else {
    iVar8 = iVar3 * 2;
    if (iVar6 != iVar8 && SBORROW4(iVar6,iVar8) == iVar6 + iVar3 * -2 < 0) {
      iVar8 = iVar6;
    }
    if (iVar8 <= iVar3) goto LAB_00158f6d;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (char *)(*(pIVar5->IO).MemAllocFn)((long)iVar8);
  pcVar7 = (this->Buf).Data;
  if (pcVar7 == (char *)0x0) {
LAB_00158feb:
    pcVar7 = (char *)0x0;
    pIVar5 = GImGui;
  }
  else {
    memcpy(__dest,pcVar7,(long)(this->Buf).Size);
    pIVar5 = GImGui;
    pcVar7 = (this->Buf).Data;
    if (pcVar7 == (char *)0x0) goto LAB_00158feb;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar5->IO).MemFreeFn)(pcVar7);
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = iVar8;
LAB_00159000:
  (this->Buf).Size = iVar6;
  ImFormatStringV(__dest + (long)iVar2 + -1,iVar4 + 1,fmt,&local_48);
  return;
}

Assistant:

void ImGuiTextBuffer::appendv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = vsnprintf(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
        return;

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off] - 1, len+1, fmt, args_copy);
}